

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_set_float_vector(exr_context_t ctxt,int part_index,char *name,int32_t sz,float *val)

{
  exr_attr_float_vector_t *fv;
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_list_t *list;
  undefined8 uStackY_50;
  exr_attribute_t *attr;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_50 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      if (0x7fffffff < (ulong)((long)sz * 4) || sz < 0) {
        eVar1 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"Invalid size (%d) for float vector \'%s\'",sz,name,
                           *(code **)(ctxt + 0x48));
        return eVar1;
      }
      if (val == (float *)0x0) {
        eVar1 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"No input values for setting \'%s\', type \'floatvector\'",name,
                           *(code **)(ctxt + 0x48));
        return eVar1;
      }
      list = (exr_attribute_list_t *)
             (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
      eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
      if (eVar1 == 0) {
        if (attr->type != EXR_ATTR_FLOAT_VECTOR) {
          eVar1 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x10,
                             "\'%s\' requested type \'floatvector\', but attribute is type \'%s\'",
                             name,attr->type_name);
          return eVar1;
        }
        fv = (attr->field_6).floatvector;
        if ((fv->length == sz) && (0 < fv->alloc_size)) {
          memcpy(fv->arr,val,(long)sz * 4);
          return 0;
        }
        if (*ctxt != (_priv_exr_context_t)0x1) {
          eVar1 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x14,
                             "Existing float vector \'%s\' has %d, requested %d, unable to change",
                             name,fv->length,sz);
          return eVar1;
        }
        exr_attr_float_vector_destroy(ctxt,fv);
      }
      else {
        if (eVar1 != 0xf) {
          return eVar1;
        }
        if (*ctxt != (_priv_exr_context_t)0x1) {
          return 0xf;
        }
        eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_FLOAT_VECTOR,0,(uint8_t **)0x0,&attr);
        if (eVar1 != 0) {
          return eVar1;
        }
      }
      eVar1 = exr_attr_float_vector_create(ctxt,(attr->field_6).floatvector,val,sz);
      return eVar1;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_50 = 8;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_50);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_float_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       sz,
    const float*  val)
{
    exr_attribute_t* attr  = NULL;
    exr_result_t     rv    = EXR_ERR_SUCCESS;
    size_t           bytes = (size_t) sz * sizeof (float);

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (sz < 0 || bytes > (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for float vector '%s'",
            sz,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'floatvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_FLOAT_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_FLOAT_VECTOR)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'floatvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->floatvector->length == sz &&
            attr->floatvector->alloc_size > 0)
        {
            memcpy (EXR_CONST_CAST (void*, attr->floatvector->arr), val, bytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing float vector '%s' has %d, requested %d, unable to change",
                name,
                attr->floatvector->length,
                sz));
        }
        else
        {
            exr_attr_float_vector_destroy (ctxt, attr->floatvector);
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}